

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::MultiplyAndAdd
          (ChConstraintThreeBBShaft *this,double *result,ChVectorDynamic<double> *vect)

{
  undefined1 auVar1 [16];
  ChVariables *pCVar2;
  CoeffReturnType pdVar3;
  Scalar SVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> VStack_a8;
  Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_70;
  
  pCVar2 = (this->super_ChConstraintThree).variables_a;
  if (pCVar2->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)pCVar2->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_a,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar4 + *result;
  }
  pCVar2 = (this->super_ChConstraintThree).variables_b;
  if (pCVar2->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)pCVar2->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_b,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar4 + *result;
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled == false) {
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)vect,
                        (long)pCVar2->offset);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pdVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.
                   m_storage.m_data.array[0];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *result;
    auVar1 = vfmadd213sd_fma(auVar6,auVar5,auVar1);
    *result = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
    if (variables_a->IsActive()) {
        result += Cq_a * vect.segment(variables_a->GetOffset(), 6);
    }

    if (variables_b->IsActive()) {
        result += Cq_b * vect.segment(variables_b->GetOffset(), 6);
    }

    if (variables_c->IsActive()) {
        result += vect(variables_c->GetOffset()) * Cq_c(0);
    }
}